

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void SendCloseMsgs(SstStream Stream)

{
  _WriterCloseMsg Msg;
  void *local_28;
  ssize_t sStack_20;
  
  local_28 = (void *)0x0;
  sStack_20 = Stream->LastProvidedTimestep;
  CP_verbose(Stream,PerStepVerbose,
             "SstWriterClose, Sending Close at Timestep %ld, one to each reader\n");
  sendOneToEachReaderRank(Stream,Stream->CPInfo->SharedCM->WriterCloseFormat,&local_28,&local_28);
  Stream->CloseMessagesSent = 1;
  return;
}

Assistant:

static void SendCloseMsgs(SstStream Stream)
{
    struct _WriterCloseMsg Msg;
    STREAM_ASSERT_LOCKED(Stream);
    memset(&Msg, 0, sizeof(Msg));
    Msg.FinalTimestep = Stream->LastProvidedTimestep;
    CP_verbose(Stream, PerStepVerbose,
               "SstWriterClose, Sending Close at Timestep %ld, one to each reader\n",
               Msg.FinalTimestep);

    sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->WriterCloseFormat, &Msg,
                            &Msg.RS_Stream);
    Stream->CloseMessagesSent = 1;
}